

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

int Ssw_RarSimulateGia(Gia_Man_t *p,Ssw_RarPars_t *pPars)

{
  int iVar1;
  Vec_Int_t *vFfMask;
  Gia_Man_t *p_00;
  Gia_Man_t *pTemp;
  Vec_Int_t *vPerm;
  Aig_Man_t *pAStack_20;
  int RetValue;
  Aig_Man_t *pAig;
  Ssw_RarPars_t *pPars_local;
  Gia_Man_t *p_local;
  
  if (pPars->fUseFfGrouping == 0) {
    pAStack_20 = Gia_ManToAigSimple(p);
  }
  else {
    iVar1 = Gia_ManRegNum(p);
    vFfMask = Ssw_RarRandomPermFlop(iVar1,10);
    p_00 = Gia_ManDupPermFlopGap(p,vFfMask);
    Vec_IntFree(vFfMask);
    pAStack_20 = Gia_ManToAigSimple(p_00);
    Gia_ManStop(p_00);
  }
  iVar1 = Ssw_RarSimulate(pAStack_20,pPars);
  Abc_CexFree(p->pCexSeq);
  p->pCexSeq = pAStack_20->pSeqModel;
  pAStack_20->pSeqModel = (Abc_Cex_t *)0x0;
  Aig_ManStop(pAStack_20);
  return iVar1;
}

Assistant:

int Ssw_RarSimulateGia( Gia_Man_t * p, Ssw_RarPars_t * pPars )
{
    Aig_Man_t * pAig;
    int RetValue;
    if ( pPars->fUseFfGrouping )
    {
        Vec_Int_t * vPerm = Ssw_RarRandomPermFlop( Gia_ManRegNum(p), 10 );
        Gia_Man_t * pTemp = Gia_ManDupPermFlopGap( p, vPerm );
        Vec_IntFree( vPerm );
        pAig = Gia_ManToAigSimple( pTemp );
        Gia_ManStop( pTemp );
    }
    else
        pAig = Gia_ManToAigSimple( p );
    RetValue = Ssw_RarSimulate( pAig, pPars );
    // save counter-example
    Abc_CexFree( p->pCexSeq );
    p->pCexSeq = pAig->pSeqModel; pAig->pSeqModel = NULL;
    Aig_ManStop( pAig );
    return RetValue;
}